

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LoopLayerParams::SerializeWithCachedSizes
          (LoopLayerParams *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  if (this->maxloopiterations_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->maxloopiterations_,output);
  }
  psVar1 = (this->conditionvar_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.LoopLayerParams.conditionVar");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (2,(this->conditionvar_).ptr_,output);
  }
  if (this->conditionnetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->conditionnetwork_->super_MessageLite,output);
  }
  if (this->bodynetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->bodynetwork_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void LoopLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LoopLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 maxLoopIterations = 1;
  if (this->maxloopiterations() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->maxloopiterations(), output);
  }

  // string conditionVar = 2;
  if (this->conditionvar().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->conditionvar().data(), this->conditionvar().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.LoopLayerParams.conditionVar");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->conditionvar(), output);
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->has_conditionnetwork()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->conditionnetwork_, output);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->has_bodynetwork()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->bodynetwork_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LoopLayerParams)
}